

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

void adios2::helper::(anonymous_namespace)::SetOption<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               string *nodeName,Node *upperNode,string *hint,bool mandatory)

{
  pointer pcVar1;
  Node node;
  string local_b8;
  as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_98;
  Node local_90;
  string local_50;
  
  pcVar1 = (nodeName->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + nodeName->_M_string_length);
  anon_unknown_0::YAMLNode(&local_90,&local_b8,upperNode,hint,mandatory,Scalar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((local_90.m_isValid == true) &&
     ((local_90.m_pNode == (node *)0x0 ||
      ((((((local_90.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    local_98.node = &local_90;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()(&local_50,&local_98);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (local_90.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_invalidKey._M_dataplus._M_p != &local_90.m_invalidKey.field_2) {
    operator_delete(local_90.m_invalidKey._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}